

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::DeadCodeVarElimination::~DeadCodeVarElimination(DeadCodeVarElimination *this)

{
  IRVisitor::~IRVisitor(&this->super_IRVisitor);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        bool changed = true;

        while (changed) {
            changed = false;
            const auto& var_names = generator->get_vars();
            for (auto const& var_name : var_names) {
                auto const& var = generator->get_var(var_name);
                if (var->type() != VarType::Base) continue;
                if (var->sinks().empty()) {
                    // remove all the sources
                    remove_var(var.get());
                    changed = true;
                    break;
                }
            }
        }

        // because we run child first, the parent's content get cleared out
        // nicely before this pass runs on parent
        clear_out_ports(generator);
    }